

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.h
# Opt level: O2

Histogram * __thiscall Histogram::operator=(Histogram *this,Histogram *src)

{
  double dVar1;
  size_t i;
  long lVar2;
  
  dVar1 = src->EXP_BASE_LOG;
  this->EXP_BASE = src->EXP_BASE;
  this->EXP_BASE_LOG = dVar1;
  LOCK();
  (this->count).super___atomic_base<unsigned_long>._M_i =
       (src->count).super___atomic_base<unsigned_long>._M_i;
  UNLOCK();
  LOCK();
  (this->sum).super___atomic_base<unsigned_long>._M_i =
       (src->sum).super___atomic_base<unsigned_long>._M_i;
  UNLOCK();
  LOCK();
  (this->max).super___atomic_base<unsigned_long>._M_i =
       (src->max).super___atomic_base<unsigned_long>._M_i;
  UNLOCK();
  for (lVar2 = 0; lVar2 != 0x41; lVar2 = lVar2 + 1) {
    LOCK();
    this->bins[lVar2].super___atomic_base<unsigned_long>._M_i =
         src->bins[lVar2].super___atomic_base<unsigned_long>._M_i;
    UNLOCK();
  }
  return this;
}

Assistant:

Histogram& operator=(const Histogram& src) {
        EXP_BASE = src.EXP_BASE;
        EXP_BASE_LOG = src.EXP_BASE_LOG;
        count = src.getTotal();
        sum = src.getSum();
        max = src.getMax();
        for (size_t i=0; i<MAX_BINS; ++i) {
            bins[i].store( src.bins[i].load() );
        }
        return *this;
    }